

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v8::detail::
for_each_codepoint<fmt::v8::detail::compute_width(fmt::v8::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  detail *p;
  char *pcVar1;
  type size;
  size_t __n;
  anon_class_8_1_54a39806 decode;
  char buf [7];
  count_code_points local_30;
  char local_28 [8];
  
  local_30.count = (size_t *)s.size_;
  pcVar1 = s.data_;
  p = this;
  if ((char *)0x3 < pcVar1) {
    for (; p < this + (long)pcVar1 + -3;
        p = (detail *)
            for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                      ((anon_class_8_1_54a39806 *)&local_30,(char *)p)) {
    }
  }
  __n = (long)(this + (long)pcVar1) - (long)p;
  if (__n != 0) {
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[0] = '\0';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    memcpy(local_28,p,__n);
    pcVar1 = local_28;
    do {
      pcVar1 = for_each_codepoint<count_code_points>::anon_class_8_1_54a39806::operator()
                         ((anon_class_8_1_54a39806 *)&local_30,pcVar1);
    } while ((long)pcVar1 - (long)local_28 < (long)__n);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    f(cp, error);
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = decode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    p = buf;
    do {
      p = decode(p);
    } while (p - buf < num_chars_left);
  }
}